

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall IR::MultiBranchInstr::ClearTarget(MultiBranchInstr *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  MultiBranchInstr *this_local;
  
  bVar2 = BranchInstr::IsMultiBranch(&this->super_BranchInstr);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x700,"(IsMultiBranch())","IsMultiBranch()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  MapMultiBrLabels<IR::MultiBranchInstr::ClearTarget()::__0>
            (this,(anon_class_8_1_8991fb9c_for_fn)this);
  this->m_branchTargets = (void *)0x0;
  return;
}

Assistant:

void
MultiBranchInstr::ClearTarget()
{
    Assert(IsMultiBranch());

    MapMultiBrLabels([&](LabelInstr *const targetLabel)
    {
        ChangeLabelRef(targetLabel, nullptr);
    });
    m_branchTargets = nullptr;
}